

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O0

bool __thiscall
HighsTransformedLp::transform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<double,_std::allocator<double>_> *upper,
          vector<double,_std::allocator<double>_> *solval,vector<int,_std::allocator<int>_> *inds,
          double *rhs,bool *integersPositive,bool preferVbds)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  pointer pHVar7;
  reference pvVar8;
  reference pvVar9;
  value_type vVar10;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  double *in_R9;
  double dVar11;
  byte *in_stack_00000008;
  byte in_stack_00000010;
  double ub_2;
  double lb_2;
  HighsInt col_2;
  HighsInt j_2;
  double ub_1;
  double lb_1;
  HighsInt col_1;
  HighsInt j_1;
  HighsInt j;
  anon_class_8_1_ba1d61b4 IsZero;
  double maxError;
  HighsInt i_1;
  BoundType oldBoundType;
  bool infeasible_1;
  bool redundant_1;
  bool infeasible;
  bool redundant;
  double ub;
  double lb;
  HighsInt col;
  HighsInt i;
  anon_class_24_3_19d45739 remove;
  anon_class_24_3_5cef1ea4 getUb;
  anon_class_24_3_5cef1ea4 getLb;
  HighsInt numNz;
  HighsInt slackOffset;
  HighsMipSolver *mip;
  HighsCDouble tmpRhs;
  undefined4 in_stack_fffffffffffffd08;
  HighsInt in_stack_fffffffffffffd0c;
  HighsSparseVectorSum *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  byte in_stack_fffffffffffffd27;
  size_type in_stack_fffffffffffffd28;
  VarBound *in_stack_fffffffffffffd30;
  anon_class_8_1_ba1d61b4 *in_stack_fffffffffffffd38;
  HighsSparseVectorSum *in_stack_fffffffffffffd40;
  HighsSparseVectorSum *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd80;
  bool *in_stack_fffffffffffffd88;
  double dVar12;
  bool *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  VarBound *in_stack_fffffffffffffda0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda8;
  HighsImplications *in_stack_fffffffffffffdb0;
  int local_104;
  int local_e8;
  int local_e4;
  int local_cc;
  double local_c0;
  double local_b8;
  value_type local_b0;
  int local_ac;
  int *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  HighsInt *local_90;
  HighsMipSolver *local_88;
  HighsInt *local_78;
  HighsMipSolver *local_70;
  int local_60;
  HighsInt local_5c;
  HighsMipSolver *local_58;
  HighsCDouble local_50;
  byte local_39;
  double *local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  
  local_39 = in_stack_00000010 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsCDouble::HighsCDouble(&local_50,*in_R9);
  local_58 = HighsLpRelaxation::getMipSolver((HighsLpRelaxation *)*in_RDI);
  local_5c = HighsLpRelaxation::numCols((HighsLpRelaxation *)0x6b0883);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_30);
  local_60 = (int)sVar4;
  local_78 = &local_5c;
  local_70 = local_58;
  local_90 = &local_5c;
  local_88 = local_58;
  local_a8 = &local_60;
  local_a0 = local_30;
  local_98 = local_18;
  local_ac = 0;
LAB_006b0934:
  while( true ) {
    while( true ) {
      if (local_60 <= local_ac) {
        HighsSparseVectorSum::getNonzeros((HighsSparseVectorSum *)(in_RDI + 0x19));
        bVar3 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        if (bVar3) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28);
        }
        else {
          for (local_cc = 0; local_cc != local_60; local_cc = local_cc + 1) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_cc);
            if ((*pvVar9 != 0.0) || (NAN(*pvVar9))) {
              std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_cc);
              std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_cc);
              HighsSparseVectorSum::add
                        (in_stack_fffffffffffffd40,
                         (HighsInt)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                         (double)in_stack_fffffffffffffd30);
            }
          }
          HighsSparseVectorSum::
          cleanup<HighsTransformedLp::transform(std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,double&,bool&,bool)::__3&>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          dVar12 = 0.0;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6b1d08);
          if (pHVar7->feastol <= dVar12 && dVar12 != pHVar7->feastol) {
            HighsSparseVectorSum::clear(in_stack_fffffffffffffd60);
            return false;
          }
          HighsSparseVectorSum::getNonzeros((HighsSparseVectorSum *)(in_RDI + 0x19));
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8);
          sVar4 = std::vector<int,_std::allocator<int>_>::size(local_30);
          local_60 = (int)sVar4;
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd28);
          for (local_e4 = 0; local_e4 != local_60; local_e4 = local_e4 + 1) {
            std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_e4);
            dVar12 = HighsSparseVectorSum::getValue
                               (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_e4);
            *pvVar9 = dVar12;
          }
          HighsSparseVectorSum::clear(in_stack_fffffffffffffd60);
        }
        for (local_e8 = 0; local_e8 != local_60; local_e8 = local_e8 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_e8);
          iVar2 = *pvVar5;
          dVar12 = transform::anon_class_24_3_5cef1ea4::operator()
                             ((anon_class_24_3_5cef1ea4 *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          dVar11 = transform::anon_class_24_3_5cef1ea4::operator()
                             ((anon_class_24_3_5cef1ea4 *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          bVar3 = HighsLpRelaxation::isColIntegral
                            ((HighsLpRelaxation *)
                             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                             (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          if (((bVar3) &&
              (pvVar8 = std::
                        vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                      *)(in_RDI + 0x16),(long)iVar2), *pvVar8 != kVariableLb)) &&
             (pvVar8 = std::
                       vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                       ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                     *)(in_RDI + 0x16),(long)iVar2), *pvVar8 != kVariableUb)) {
            if ((*in_stack_00000008 & 1) == 0) {
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                                  (long)iVar2);
              dVar12 = *pvVar9;
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                                  (long)iVar2);
              if (*pvVar9 <= dVar12) {
                pvVar8 = std::
                         vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                         ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                       *)(in_RDI + 0x16),(long)iVar2);
                *pvVar8 = kSimpleUb;
              }
              else {
                pvVar8 = std::
                         vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                         ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                       *)(in_RDI + 0x16),(long)iVar2);
                *pvVar8 = kSimpleLb;
              }
            }
            else if ((((dVar12 != -INFINITY) || (NAN(dVar12))) &&
                     (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                         (local_18,(long)local_e8), 0.0 < *pvVar9)) ||
                    ((dVar11 == INFINITY && (!NAN(dVar11))))) {
              pvVar8 = std::
                       vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                       ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                     *)(in_RDI + 0x16),(long)iVar2);
              *pvVar8 = kSimpleLb;
            }
            else {
              pvVar8 = std::
                       vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                       ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                     *)(in_RDI + 0x16),(long)iVar2);
              *pvVar8 = kSimpleUb;
            }
          }
        }
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28);
        for (local_104 = 0; local_104 != local_60; local_104 = local_104 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_104);
          iVar2 = *pvVar5;
          dVar12 = transform::anon_class_24_3_5cef1ea4::operator()
                             ((anon_class_24_3_5cef1ea4 *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          dVar11 = transform::anon_class_24_3_5cef1ea4::operator()
                             ((anon_class_24_3_5cef1ea4 *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          dVar11 = dVar11 - dVar12;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_20,(long)local_104);
          *pvVar9 = dVar11;
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)iVar2);
          switch(*pvVar8) {
          case kSimpleUb:
            std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_104);
            HighsCDouble::operator-=
                      ((HighsCDouble *)in_stack_fffffffffffffd10,
                       (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_104);
            vVar10 = -*pvVar9;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_104);
            *pvVar9 = vVar10;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                                (long)iVar2);
            vVar10 = *pvVar9;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_104);
            *pvVar9 = vVar10;
            break;
          case kSimpleLb:
            std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_104);
            HighsCDouble::operator-=
                      ((HighsCDouble *)in_stack_fffffffffffffd10,
                       (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                                (long)iVar2);
            vVar10 = *pvVar9;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_104);
            *pvVar9 = vVar10;
            break;
          case kVariableUb:
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                                (long)iVar2);
            vVar10 = *pvVar9;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_104);
            *pvVar9 = vVar10;
            break;
          case kVariableLb:
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                                (long)iVar2);
            vVar10 = *pvVar9;
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_104);
            *pvVar9 = vVar10;
          }
          bVar3 = HighsLpRelaxation::isColIntegral
                            ((HighsLpRelaxation *)
                             CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                             (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          if (bVar3) {
            in_stack_fffffffffffffd27 = false;
            if ((*in_stack_00000008 & 1) != 0) {
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_18,(long)local_104);
              in_stack_fffffffffffffd27 = 0.0 < *pvVar9;
            }
            *in_stack_00000008 = in_stack_fffffffffffffd27;
          }
        }
        dVar12 = HighsCDouble::operator_cast_to_double(&local_50);
        *local_38 = dVar12;
        if (local_60 == 0) {
          dVar12 = *local_38;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6b2450);
          if (-pHVar7->feastol <= dVar12) {
            return false;
          }
        }
        return true;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_ac);
      local_b0 = *pvVar5;
      local_b8 = transform::anon_class_24_3_5cef1ea4::operator()
                           ((anon_class_24_3_5cef1ea4 *)
                            CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                            (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      local_c0 = transform::anon_class_24_3_5cef1ea4::operator()
                           ((anon_class_24_3_5cef1ea4 *)
                            CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                            (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      if ((local_58->options_mip_->super_HighsOptionsStruct).small_matrix_value <=
          local_c0 - local_b8) break;
      std::min<double>(&local_b8,&local_c0);
      std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
      HighsCDouble::operator-=
                ((HighsCDouble *)in_stack_fffffffffffffd10,
                 (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      transform::anon_class_24_3_19d45739::operator()
                ((anon_class_24_3_19d45739 *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    }
    if ((((local_b8 == -INFINITY) && (!NAN(local_b8))) && (local_c0 == INFINITY)) &&
       (!NAN(local_c0))) {
      HighsSparseVectorSum::clear(in_stack_fffffffffffffd60);
      return false;
    }
    pvVar6 = std::
             vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
             ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                           *)(in_RDI + 1),(long)local_b0);
    if (pvVar6->first != -1) {
      std::
      vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
      ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    *)(in_RDI + 1),(long)local_b0);
      dVar11 = HighsImplications::VarBound::maxValue(in_stack_fffffffffffffd30);
      dVar12 = local_c0;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6b0aff);
      if (dVar12 + pHVar7->feastol < dVar11) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x6b0b47);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 1),(long)local_b0);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 1),(long)local_b0);
        in_stack_fffffffffffffd08 = 0;
        HighsImplications::cleanupVub
                  (in_stack_fffffffffffffdb0,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                   (HighsInt)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   (double)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
      }
    }
    pvVar6 = std::
             vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
             ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                           *)(in_RDI + 4),(long)local_b0);
    if (pvVar6->first != -1) {
      std::
      vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
      ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                    *)(in_RDI + 4),(long)local_b0);
      dVar11 = HighsImplications::VarBound::minValue(in_stack_fffffffffffffd30);
      dVar12 = local_b8;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6b0c58);
      if (dVar11 < dVar12 - pHVar7->feastol) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x6b0ca0);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 4),(long)local_b0);
        std::
        vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
        ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                      *)(in_RDI + 4),(long)local_b0);
        in_stack_fffffffffffffd08 = 0;
        HighsImplications::cleanupVlb
                  (in_stack_fffffffffffffdb0,(HighsInt)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                   (HighsInt)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   (double)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                   SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
      }
    }
    pvVar8 = std::
             vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>::
             operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                         *)(in_RDI + 0x16),(long)local_b0);
    vVar1 = *pvVar8;
    bVar3 = HighsLpRelaxation::isColIntegral
                      ((HighsLpRelaxation *)
                       CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                       (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    if (!bVar3) break;
    if (1.5 < local_c0 - local_b8) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x13),(long)local_b0)
      ;
      if ((*pvVar9 == 0.0) && (!NAN(*pvVar9))) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),(long)local_b0);
        if ((*pvVar9 != 0.0) || (NAN(*pvVar9))) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                              (long)local_b0);
          if ((*pvVar9 != 0.0) || (NAN(*pvVar9))) {
            pvVar6 = std::
                     vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                                   *)(in_RDI + 4),(long)local_b0);
            if (pvVar6->first != -1) {
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                                  (long)local_b0);
              dVar12 = *pvVar9;
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                                  (long)local_b0);
              dVar11 = *pvVar9;
              pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x6b1072);
              if (dVar11 - pHVar7->feastol <= dVar12) {
                pvVar6 = std::
                         vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                         ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                                       *)(in_RDI + 1),(long)local_b0);
                if (pvVar6->first != -1) {
                  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),
                                      (long)local_b0);
                  dVar12 = *pvVar9;
                  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                                      (long)local_b0);
                  dVar11 = *pvVar9;
                  pHVar7 = std::
                           unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                         *)0x6b113b);
                  if (dVar11 - pHVar7->feastol <= dVar12) {
                    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (local_18,(long)local_ac);
                    if (*pvVar9 <= 0.0) {
                      pvVar8 = std::
                               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                             *)(in_RDI + 0x16),(long)local_b0);
                      *pvVar8 = kVariableLb;
                    }
                    else {
                      pvVar8 = std::
                               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                             *)(in_RDI + 0x16),(long)local_b0);
                      *pvVar8 = kVariableUb;
                    }
                    goto LAB_006b16f3;
                  }
                }
                pvVar8 = std::
                         vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                         ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                       *)(in_RDI + 0x16),(long)local_b0);
                *pvVar8 = kVariableLb;
                goto LAB_006b16f3;
              }
            }
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kVariableUb;
            goto LAB_006b16f3;
          }
        }
      }
    }
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),(long)local_b0);
    dVar12 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_b0);
    dVar11 = *pvVar9;
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6b0e8c);
    if (dVar11 - pHVar7->feastol <= dVar12) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)local_b0);
      dVar12 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),(long)local_b0);
      dVar11 = *pvVar9;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6b0f30);
      if (dVar11 - pHVar7->feastol <= dVar12) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
        if (*pvVar9 <= 0.0) {
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)local_b0);
          *pvVar8 = kSimpleUb;
        }
        else {
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)local_b0);
          *pvVar8 = kSimpleLb;
        }
      }
      else {
        pvVar8 = std::
                 vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                 ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                               *)(in_RDI + 0x16),(long)local_b0);
        *pvVar8 = kSimpleUb;
      }
    }
    else {
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = kSimpleLb;
    }
    local_ac = local_ac + 1;
  }
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_b0);
  dVar12 = *pvVar9;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_b0);
  dVar11 = *pvVar9;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6b124a);
  if (dVar11 - pHVar7->feastol <= dVar12) {
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_b0);
    dVar12 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_b0);
    dVar11 = *pvVar9;
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6b140e);
    if (dVar11 - pHVar7->feastol <= dVar12) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
      if (*pvVar9 <= 0.0) {
        pvVar6 = std::
                 vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                               *)(in_RDI + 1),(long)local_b0);
        if (pvVar6->first == -1) {
          if (((local_39 & 1) == 0) ||
             (pvVar6 = std::
                       vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                       ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                                     *)(in_RDI + 4),(long)local_b0), pvVar6->first == -1)) {
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kSimpleUb;
          }
          else {
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kVariableLb;
          }
        }
        else {
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)local_b0);
          *pvVar8 = kVariableUb;
        }
      }
      else {
        pvVar6 = std::
                 vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                               *)(in_RDI + 4),(long)local_b0);
        if (pvVar6->first == -1) {
          if (((local_39 & 1) == 0) ||
             (pvVar6 = std::
                       vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                       ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                                     *)(in_RDI + 1),(long)local_b0), pvVar6->first == -1)) {
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kSimpleLb;
          }
          else {
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kVariableUb;
          }
        }
        else {
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)local_b0);
          *pvVar8 = kVariableLb;
        }
      }
    }
    else {
      pvVar6 = std::
               vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                             *)(in_RDI + 1),(long)local_b0);
      if (pvVar6->first == -1) {
        pvVar8 = std::
                 vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                 ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                               *)(in_RDI + 0x16),(long)local_b0);
        *pvVar8 = kSimpleUb;
      }
      else {
        if (((local_39 & 1) == 0) &&
           (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_ac), 0.0 < *pvVar9 || *pvVar9 == 0.0)) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),
                              (long)local_b0);
          dVar12 = *pvVar9;
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                              (long)local_b0);
          dVar11 = *pvVar9;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6b1507);
          if (dVar12 <= dVar11 + pHVar7->feastol) {
            pvVar8 = std::
                     vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                     ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                   *)(in_RDI + 0x16),(long)local_b0);
            *pvVar8 = kSimpleUb;
            goto LAB_006b16f3;
          }
        }
        pvVar8 = std::
                 vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                 ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                               *)(in_RDI + 0x16),(long)local_b0);
        *pvVar8 = kVariableUb;
      }
    }
  }
  else {
    pvVar6 = std::
             vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
             ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                           *)(in_RDI + 4),(long)local_b0);
    if (pvVar6->first == -1) {
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = kSimpleLb;
    }
    else {
      if (((local_39 & 1) == 0) &&
         (pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac)
         , *pvVar9 <= 0.0)) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),(long)local_b0);
        dVar12 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd),(long)local_b0
                           );
        dVar11 = *pvVar9;
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x6b1344);
        if (dVar12 <= dVar11 + pHVar7->feastol) {
          pvVar8 = std::
                   vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                   ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                                 *)(in_RDI + 0x16),(long)local_b0);
          *pvVar8 = kSimpleLb;
          goto LAB_006b16f3;
        }
      }
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = kVariableLb;
    }
  }
LAB_006b16f3:
  pvVar8 = std::
           vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>::
           operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                       *)(in_RDI + 0x16),(long)local_b0);
  switch(*pvVar8) {
  case kSimpleUb:
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    if (*pvVar9 <= 0.0 && *pvVar9 != 0.0) {
      std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
      HighsCDouble::operator-=
                ((HighsCDouble *)in_stack_fffffffffffffd10,
                 (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = vVar1;
      transform::anon_class_24_3_19d45739::operator()
                ((anon_class_24_3_19d45739 *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      goto LAB_006b0934;
    }
    break;
  case kSimpleLb:
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    if (0.0 < *pvVar9) {
      std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
      HighsCDouble::operator-=
                ((HighsCDouble *)in_stack_fffffffffffffd10,
                 (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = vVar1;
      transform::anon_class_24_3_19d45739::operator()
                ((anon_class_24_3_19d45739 *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      goto LAB_006b0934;
    }
    break;
  case kVariableUb:
    pvVar6 = std::
             vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
             ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                           *)(in_RDI + 1),(long)local_b0);
    in_stack_fffffffffffffda0 = (VarBound *)(pvVar6->second).constant;
    std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    HighsCDouble::operator-=
              ((HighsCDouble *)in_stack_fffffffffffffd10,
               (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    in_stack_fffffffffffffdb0 = (HighsImplications *)(in_RDI + 0x19);
    std::
    vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
    ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  *)(in_RDI + 1),(long)local_b0);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    in_stack_fffffffffffffda8 = (vector<int,_std::allocator<int>_> *)*pvVar9;
    std::
    vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
    ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  *)(in_RDI + 1),(long)local_b0);
    HighsSparseVectorSum::add
              (in_stack_fffffffffffffd40,(HighsInt)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (double)in_stack_fffffffffffffd30);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    vVar10 = *pvVar9;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    *pvVar9 = -vVar10;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    if (0.0 < *pvVar9) {
      in_stack_fffffffffffffd9c = CONCAT13(vVar1,(int3)in_stack_fffffffffffffd9c);
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = (value_type)((uint)in_stack_fffffffffffffd9c >> 0x18);
      transform::anon_class_24_3_19d45739::operator()
                ((anon_class_24_3_19d45739 *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      goto LAB_006b0934;
    }
    break;
  case kVariableLb:
    std::
    vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
    ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  *)(in_RDI + 4),(long)local_b0);
    std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    HighsCDouble::operator-=
              ((HighsCDouble *)in_stack_fffffffffffffd10,
               (double)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::
    vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
    ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  *)(in_RDI + 4),(long)local_b0);
    std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    std::
    vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
    ::operator[]((vector<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  *)(in_RDI + 4),(long)local_b0);
    HighsSparseVectorSum::add
              (in_stack_fffffffffffffd40,(HighsInt)((ulong)in_stack_fffffffffffffd38 >> 0x20),
               (double)in_stack_fffffffffffffd30);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    if (0.0 < *pvVar9) {
      pvVar8 = std::
               vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
               ::operator[]((vector<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                             *)(in_RDI + 0x16),(long)local_b0);
      *pvVar8 = vVar1;
      transform::anon_class_24_3_19d45739::operator()
                ((anon_class_24_3_19d45739 *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
      goto LAB_006b0934;
    }
  }
  local_ac = local_ac + 1;
  goto LAB_006b0934;
}

Assistant:

bool HighsTransformedLp::transform(std::vector<double>& vals,
                                   std::vector<double>& upper,
                                   std::vector<double>& solval,
                                   std::vector<HighsInt>& inds, double& rhs,
                                   bool& integersPositive, bool preferVbds) {
  // vector sum should be empty
  assert(vectorsum.getNonzeros().empty());

  HighsCDouble tmpRhs = rhs;

  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = lprelaxation.numCols();

  HighsInt numNz = inds.size();

  auto getLb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_lower_[col]
                              : lprelaxation.slackLower(col - slackOffset));
  };

  auto getUb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_upper_[col]
                              : lprelaxation.slackUpper(col - slackOffset));
  };

  auto remove = [&](HighsInt position) {
    numNz--;
    inds[position] = inds[numNz];
    vals[position] = vals[numNz];
    inds[numNz] = 0;
    vals[numNz] = 0;
  };

  HighsInt i = 0;
  while (i < numNz) {
    HighsInt col = inds[i];

    double lb = getLb(col);
    double ub = getUb(col);

    if (ub - lb < mip.options_mip_->small_matrix_value) {
      tmpRhs -= std::min(lb, ub) * vals[i];
      remove(i);
      continue;
    }

    if (lb == -kHighsInf && ub == kHighsInf) {
      vectorsum.clear();
      return false;
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable upper bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable upper
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable upper bound.
    if (bestVub[col].first != -1 &&
        bestVub[col].second.maxValue() > ub + mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVub(col, bestVub[col].first,
                                            bestVub[col].second, ub, redundant,
                                            infeasible, false);
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable lower bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable lower
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable lower bound.
    if (bestVlb[col].first != -1 &&
        bestVlb[col].second.minValue() < lb - mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVlb(col, bestVlb[col].first,
                                            bestVlb[col].second, lb, redundant,
                                            infeasible, false);
    }

    // store the old bound type so that we can restore it if the continuous
    // column is relaxed out anyways. This allows to correctly transform and
    // then untransform multiple base rows which is useful to compute cuts based
    // on several transformed base rows. It could otherwise lead to bugs if a
    // column is first transformed with a simple bound and not relaxed but for
    // another base row is transformed and relaxed with a variable bound. Should
    // the non-relaxed column now be untransformed we would wrongly use the
    // variable bound even though this is not the correct way to untransform the
    // column.
    BoundType oldBoundType = boundTypes[col];

    if (lprelaxation.isColIntegral(col)) {
      if (ub - lb <= 1.5 || boundDist[col] != 0.0 || simpleLbDist[col] == 0 ||
          simpleUbDist[col] == 0) {
        // since we skip the handling of variable bound constraints for all
        // binary and some general-integer variables here, the bound type used
        // should be a simple lower or upper bound
        if (simpleLbDist[col] < simpleUbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else if (simpleUbDist[col] <
                   simpleLbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleUb;
        } else if (vals[i] > 0) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else {
          boundTypes[col] = BoundType::kSimpleUb;
        }
        i++;
        continue;
      }
      if (bestVlb[col].first == -1 ||
          ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else if (bestVub[col].first == -1 ||
                 lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      } else if (vals[i] > 0) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      }
    } else {
      if (lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        if (bestVlb[col].first == -1)
          boundTypes[col] = BoundType::kSimpleLb;
        else if (preferVbds || vals[i] > 0 ||
                 simpleLbDist[col] > lbDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else if (ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        if (bestVub[col].first == -1)
          boundTypes[col] = BoundType::kSimpleUb;
        else if (preferVbds || vals[i] < 0 ||
                 simpleUbDist[col] > ubDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      } else if (vals[i] > 0) {
        if (bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else if (preferVbds && bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else {
        if (bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else if (preferVbds && bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      }
    }

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb:
        if (vals[i] > 0) {
          // relax away using lower bound
          tmpRhs -= lb * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kSimpleUb:
        if (vals[i] < 0) {
          // relax away using upper bound
          tmpRhs -= ub * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableLb:
        tmpRhs -= bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, vals[i] * bestVlb[col].second.coef);
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableUb:
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vals[i] = -vals[i];
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
    }
    // move to next element
    i++;
  }

  if (!vectorsum.getNonzeros().empty()) {
    for (HighsInt i = 0; i != numNz; ++i) {
      if (vals[i] != 0.0) vectorsum.add(inds[i], vals[i]);
    }

    double maxError = 0.0;
    auto IsZero = [&](HighsInt col, double val) {
      if (std::abs(val) <= mip.options_mip_->small_matrix_value) return true;
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (maxError > mip.mipdata_->feastol) {
      vectorsum.clear();
      return false;
    }

    inds = vectorsum.getNonzeros();
    numNz = inds.size();

    vals.resize(numNz);
    for (HighsInt j = 0; j != numNz; ++j) vals[j] = vectorsum.getValue(inds[j]);

    vectorsum.clear();
  } else {
    vals.resize(numNz);
    inds.resize(numNz);
  }

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    // get bounds
    double lb = getLb(col);
    double ub = getUb(col);

    // variable should not be free
    assert(lb != -kHighsInf || ub != kHighsInf);

    // set bound type for previously unprocessed integer-constrained variables
    if (!lprelaxation.isColIntegral(col)) continue;

    // do not overwrite bound type for integral slacks from vlb / vub
    // constraints
    if (boundTypes[col] == BoundType::kVariableLb ||
        boundTypes[col] == BoundType::kVariableUb)
      continue;

    // complement integers to make coefficients positive if both bounds are
    // finite; otherwise, complement integers with closest bound.
    // take into account 'integersPositive' provided by caller.
    if (integersPositive) {
      if ((lb != -kHighsInf && vals[j] > 0) || ub == kHighsInf)
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    } else {
      if (lbDist[col] < ubDist[col])
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    }
  }

  upper.resize(numNz);
  solval.resize(numNz);

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    double lb = getLb(col);
    double ub = getUb(col);

    upper[j] = ub - lb;

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb: {
        // shift (lower bound)
        assert(lb != -kHighsInf);
        tmpRhs -= lb * vals[j];
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kSimpleUb: {
        // complement (upper bound)
        assert(ub != kHighsInf);
        tmpRhs -= ub * vals[j];
        vals[j] = -vals[j];
        solval[j] = ubDist[col];
        break;
      }
      case BoundType::kVariableLb: {
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kVariableUb: {
        solval[j] = ubDist[col];
        break;
      }
    }

    // check if all integer-constrained variables have positive coefficients
    if (lprelaxation.isColIntegral(col))
      integersPositive = integersPositive && vals[j] > 0;
  }

  rhs = double(tmpRhs);

  if (numNz == 0 && rhs >= -mip.mipdata_->feastol) return false;

  return true;
}